

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::resize(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *this,size_t new_capacity)

{
  size_type *psVar1;
  ctrl_t *p;
  slot_type *psVar2;
  size_t capacity;
  pointer pcVar3;
  undefined1 auVar4 [16];
  size_type sVar5;
  unsigned_long uVar6;
  size_t i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_t hash;
  size_t sVar8;
  FindInfo FVar9;
  Layout LVar10;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar2 = this->slots_;
    capacity = this->capacity_;
    this->capacity_ = new_capacity;
    initialize_slots(this);
    if (capacity == 0) {
      return;
    }
    paVar7 = &(psVar2->value).first.field_2;
    sVar8 = 0;
    do {
      if (-1 < p[sVar8]) {
        if ((this->settings_).
            super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
            .value.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        uVar6 = (*(this->settings_).
                  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  .
                  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                  .value._M_invoker)
                          ((_Any_data *)
                           &(this->settings_).
                            super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                            .
                            super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar7 + -1));
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar6;
        hash = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar9 = find_first_non_full(this,hash);
        i = FVar9.offset;
        set_ctrl(this,i,(byte)hash & 0x7f);
        psVar2 = this->slots_ + i;
        psVar1 = (size_type *)((long)this->slots_ + i * 0x28 + 0x10);
        psVar1[-2] = (size_type)psVar1;
        pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (paVar7 + -1))->_M_dataplus)._M_p;
        if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3) {
          sVar5 = *(size_type *)((long)paVar7 + 8);
          *psVar1 = paVar7->_M_allocated_capacity;
          psVar1[1] = sVar5;
        }
        else {
          (psVar2->value).first._M_dataplus._M_p = pcVar3;
          (psVar2->value).first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        (psVar2->value).first._M_string_length = *(size_type *)((long)paVar7 + -8);
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar7 + -1))->
        _M_dataplus)._M_p = (pointer)paVar7;
        *(size_type *)((long)paVar7 + -8) = 0;
        paVar7->_M_local_buf[0] = '\0';
        (psVar2->value).second = *(int *)(paVar7 + 1);
      }
      sVar8 = sVar8 + 1;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar7 + 0x28);
    } while (capacity != sVar8);
    LVar10 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)&this->settings_,p,
               (LVar10.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                .size_[0] + 7 & 0xfffffffffffffff8) +
               LVar10.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
               .size_[1] * 0x28);
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                ,0x72e,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::resize(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }